

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

char * skipDollarQuotedString(char *zSql,char *delimiterStart,idx_t delimiterLength)

{
  char *pcVar1;
  int iVar2;
  char *__s1;
  size_t in_RDX;
  void *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *start;
  char *local_10;
  
  local_10 = in_RDI;
  do {
    pcVar1 = local_10;
    if (*local_10 == '\0') {
      return (char *)0x0;
    }
    if (*local_10 == '$') {
      __s1 = local_10 + 1;
      local_10 = __s1;
      while( true ) {
        bVar3 = false;
        if (*local_10 != '\0') {
          bVar3 = *local_10 != '$';
        }
        if (!bVar3) break;
        local_10 = local_10 + 1;
      }
      if (*local_10 == '\0') {
        return (char *)0x0;
      }
      if ((in_RDX == (long)local_10 - (long)__s1) &&
         (iVar2 = memcmp(__s1,in_RSI,in_RDX), iVar2 == 0)) {
        return local_10;
      }
    }
    local_10 = pcVar1 + 1;
  } while( true );
}

Assistant:

const char *skipDollarQuotedString(const char *zSql, const char *delimiterStart, idx_t delimiterLength) {
	for (; *zSql; zSql++) {
		if (*zSql == '$') {
			// found a dollar
			// move forward and find the next dollar
			zSql++;
			auto start = zSql;
			while (*zSql && *zSql != '$') {
				zSql++;
			}
			if (!zSql[0]) {
				// reached end of string while looking for the dollar
				return nullptr;
			}
			// check if the dollar quoted string name matches
			if (delimiterLength == idx_t(zSql - start)) {
				if (memcmp(start, delimiterStart, delimiterLength) == 0) {
					return zSql;
				}
			}
			// dollar does not match - reset position to start and keep looking
			zSql = start - 1;
		}
	}
	// unterminated
	return nullptr;
}